

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t functionDefinition_00;
  size_t slotCount;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t result;
  sysbvm_tuple_t captureValue;
  sysbvm_tuple_t captureBinding;
  size_t i;
  sysbvm_tuple_t captureVector;
  size_t captureVectorSize;
  sysbvm_tuple_t captureList;
  sysbvm_tuple_t functionDefinitionOperand;
  sysbvm_functionDefinition_t *functionDefinition;
  sysbvm_astLambdaNode_t **lambdaNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  sVar2 = *(sysbvm_tuple_t *)(*arguments + 0x60);
  functionDefinition_00 =
       sysbvm_functionBytecodeAssembler_addLiteral
                 (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2);
  if (*(long *)(sVar2 + 0x80) == 0) {
    if (*(long *)(sVar2 + 0x78) == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:1566: assertion failure: functionDefinition->sourceAnalyzedDefinition"
                );
    }
    captureVectorSize = *(size_t *)(*(long *)(sVar2 + 0x78) + 0x20);
  }
  else {
    captureVectorSize = *(size_t *)(*(long *)(sVar2 + 0x80) + 0x48);
  }
  slotCount = sysbvm_array_getSize(captureVectorSize);
  sVar2 = sysbvm_array_create(context,slotCount);
  for (captureBinding = 0; captureBinding < slotCount; captureBinding = captureBinding + 1) {
    sVar3 = sysbvm_array_at(captureVectorSize,captureBinding);
    sVar3 = sysbvm_symbolCaptureBinding_getSourceBinding(sVar3);
    sVar3 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,sVar3);
    sysbvm_array_atPut(sVar2,captureBinding,sVar3);
  }
  sVar3 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  sysbvm_functionBytecodeAssembler_makeClosureWithCaptures
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar3,
             functionDefinition_00,sVar2);
  if (*(long *)(*arguments + 0x68) != 0) {
    sysbvm_functionBytecodeDirectCompiler_setBindingValue
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
               *(sysbvm_tuple_t *)(*arguments + 0x68),sVar3);
  }
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;

    sysbvm_functionDefinition_t *functionDefinition = (sysbvm_functionDefinition_t*)(*lambdaNode)->functionDefinition;
    sysbvm_tuple_t functionDefinitionOperand = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (sysbvm_tuple_t)functionDefinition);

    sysbvm_tuple_t captureList = SYSBVM_NULL_TUPLE;
    if(functionDefinition->bytecode)
    {
        captureList = ((sysbvm_functionBytecode_t*)functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(functionDefinition->sourceAnalyzedDefinition);
        captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    size_t captureVectorSize = sysbvm_array_getSize(captureList);
    sysbvm_tuple_t captureVector = sysbvm_array_create(context, captureVectorSize);
    
    for(size_t i = 0; i < captureVectorSize; ++i)
    {
        sysbvm_tuple_t captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(captureList, i));
        sysbvm_tuple_t captureValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, *compiler, captureBinding);

        sysbvm_array_atPut(captureVector, i, captureValue);
    }

    sysbvm_tuple_t result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*lambdaNode)->super.analyzedType);
    sysbvm_functionBytecodeAssembler_makeClosureWithCaptures(context, (*compiler)->assembler, result, functionDefinitionOperand, captureVector);

    if((*lambdaNode)->binding)
        sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*lambdaNode)->binding, result);
    return result;
}